

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall
xmrig::WriteBaton::WriteBaton
          (WriteBaton *this,stringstream *ss,char *data,size_t size,HttpContext *ctx)

{
  undefined8 uVar1;
  void *pvVar2;
  void *in_RCX;
  void *in_RDX;
  Baton<uv_write_s> *in_RDI;
  void *in_R8;
  
  Baton<uv_write_s>::Baton(in_RDI);
  in_RDI[1].req.reserved[2] = in_R8;
  std::__cxx11::stringstream::str();
  uVar1 = std::__cxx11::string::size();
  *(undefined8 *)&in_RDI[1].req.type = uVar1;
  pvVar2 = (void *)std::__cxx11::string::c_str();
  in_RDI[1].req.data = pvVar2;
  if (in_RDX == (void *)0x0) {
    in_RDI[1].req.reserved[0] = (void *)0x0;
    in_RDI[1].req.reserved[1] = (void *)0x0;
  }
  else {
    in_RDI[1].req.reserved[1] = in_RCX;
    pvVar2 = operator_new__((ulong)in_RCX);
    in_RDI[1].req.reserved[0] = pvVar2;
    memcpy(in_RDI[1].req.reserved[0],in_RDX,(size_t)in_RCX);
  }
  return;
}

Assistant:

inline WriteBaton(const std::stringstream &ss, const char *data, size_t size, HttpContext *ctx) :
        m_ctx(ctx),
        m_header(ss.str())
    {
        bufs[0].len  = m_header.size();
        bufs[0].base = const_cast<char *>(m_header.c_str());

        if (data) {
            bufs[1].len  = size;
            bufs[1].base = new char[size];
            memcpy(bufs[1].base, data, size);
        }
        else {
            bufs[1].base = nullptr;
            bufs[1].len  = 0;
        }
    }